

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_all_gej(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  secp256k1_fe *in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t i;
  secp256k1_fe u;
  secp256k1_fe *psVar1;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  
  if (in_RDX != (secp256k1_fe *)0x0) {
    memcpy(in_RDI,(void *)(in_RSI + 0x50),0x28);
    for (psVar1 = (secp256k1_fe *)0x1; psVar1 < in_RDX;
        psVar1 = (secp256k1_fe *)((long)psVar1->n + 1)) {
      secp256k1_fe_impl_mul(in_stack_ffffffffffffffc0,psVar1,(secp256k1_fe *)0x11fa05);
    }
    secp256k1_fe_impl_inv((secp256k1_fe *)u.n[1],(secp256k1_fe *)u.n[0]);
    for (psVar1 = in_RDX + -1; psVar1 = (secp256k1_fe *)((long)psVar1->n + 0x27),
        psVar1 != (secp256k1_fe *)0x0; psVar1 = psVar1 + -1) {
      secp256k1_fe_impl_mul(in_stack_ffffffffffffffc0,psVar1,(secp256k1_fe *)0x11fa71);
      secp256k1_fe_impl_mul(in_stack_ffffffffffffffc0,psVar1,(secp256k1_fe *)0x11fa92);
    }
    memcpy(in_RDI,&stack0xffffffffffffffc0,0x28);
    for (psVar1 = (secp256k1_fe *)0x0; psVar1 < in_RDX;
        psVar1 = (secp256k1_fe *)((long)psVar1->n + 1)) {
      secp256k1_ge_set_gej_zinv((secp256k1_ge *)u.n[1],(secp256k1_gej *)u.n[0],(secp256k1_fe *)i);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
        VERIFY_CHECK(!secp256k1_gej_is_infinity(&a[i]));
    }
#endif

    if (len == 0) {
        return;
    }

    /* Use destination's x coordinates as scratch space */
    r[0].x = a[0].z;
    for (i = 1; i < len; i++) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &a[i].z);
    }
    secp256k1_fe_inv(&u, &r[len - 1].x);

    for (i = len - 1; i > 0; i--) {
        secp256k1_fe_mul(&r[i].x, &r[i - 1].x, &u);
        secp256k1_fe_mul(&u, &u, &a[i].z);
    }
    r[0].x = u;

    for (i = 0; i < len; i++) {
        secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}